

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalSerialize
          (GeneratedCodeInfo_Annotation *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint *puVar1;
  int32 iVar2;
  string *psVar3;
  void *pvVar4;
  bool bVar5;
  uint8 *puVar6;
  LogMessage *other;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  LogMessage local_70;
  LogFinisher local_31;
  
  uVar11 = (this->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar11) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar6) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/coded_stream.h"
                 ,0x35a);
      other = internal::LogMessage::operator<<(&local_70,"CHECK failed: ptr < end_: ");
      internal::LogFinisher::operator=(&local_31,other);
      internal::LogMessage::~LogMessage(&local_70);
    }
    *puVar6 = '\n';
    target = puVar6 + 2;
    for (; 0x7f < uVar11; uVar11 = uVar11 >> 7) {
      target[-1] = (byte)uVar11 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar11;
    puVar10 = (uint *)(this->path_).arena_or_elements_;
    puVar1 = puVar10 + (this->path_).current_size_;
    do {
      pbVar7 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar11 = *puVar10;
      if ((ulong)(long)(int)uVar11 < 0x80) {
        *pbVar7 = (byte)uVar11;
        target = pbVar7 + 1;
      }
      else {
        *pbVar7 = (byte)uVar11 | 0x80;
        uVar8 = (ulong)(long)(int)uVar11 >> 7;
        if (uVar11 < 0x4000) {
          pbVar7[1] = (byte)uVar8;
          target = pbVar7 + 2;
        }
        else {
          target = pbVar7 + 2;
          do {
            pbVar7 = target;
            pbVar7[-1] = (byte)uVar8 | 0x80;
            uVar9 = uVar8 >> 7;
            target = pbVar7 + 1;
            bVar5 = 0x3fff < uVar8;
            uVar8 = uVar9;
          } while (bVar5);
          *pbVar7 = (byte)uVar9;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  uVar11 = (this->_has_bits_).has_bits_[0];
  if ((uVar11 & 1) != 0) {
    psVar3 = (this->source_file_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->source_file_).ptr_,target);
  }
  if ((uVar11 & 2) != 0) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar2 = this->begin_;
    *puVar6 = '\x18';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,puVar6 + 1);
  }
  if ((uVar11 & 4) != 0) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar2 = this->end_;
    *puVar6 = ' ';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,puVar6 + 1);
  }
  pvVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    target = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8),target,stream)
    ;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo_Annotation::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_file().data(), static_cast<int>(this->_internal_source_file().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_source_file(), target);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_begin(), target);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}